

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantmatrix.cc
# Opt level: O3

void __thiscall fasttext::QuantMatrix::addRowToVector(QuantMatrix *this,Vector *x,int32_t i)

{
  real *prVar1;
  real alpha;
  
  if (this->qnorm_ == true) {
    prVar1 = ProductQuantizer::get_centroids
                       ((this->npq_)._M_t.
                        super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
                        .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,0,
                        (this->norm_codes_).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[i]);
    alpha = *prVar1;
  }
  else {
    alpha = 1.0;
  }
  ProductQuantizer::addcode
            ((this->pq_)._M_t.
             super___uniq_ptr_impl<fasttext::ProductQuantizer,_std::default_delete<fasttext::ProductQuantizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_fasttext::ProductQuantizer_*,_std::default_delete<fasttext::ProductQuantizer>_>
             .super__Head_base<0UL,_fasttext::ProductQuantizer_*,_false>._M_head_impl,x,
             (this->codes_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,i,alpha);
  return;
}

Assistant:

void QuantMatrix::addRowToVector(Vector& x, int32_t i) const {
  real norm = 1;
  if (qnorm_) {
    norm = npq_->get_centroids(0, norm_codes_[i])[0];
  }
  pq_->addcode(x, codes_.data(), i, norm);
}